

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictVectorizer.pb.h
# Opt level: O2

Int64Vector * __thiscall
CoreML::Specification::DictVectorizer::mutable_int64toindex(DictVectorizer *this)

{
  StringVector *this_00;
  
  if (this->_oneof_case_[0] == 2) {
    this_00 = (this->Map_).stringtoindex_;
  }
  else {
    clear_Map(this);
    this->_oneof_case_[0] = 2;
    this_00 = (StringVector *)operator_new(0x28);
    Int64Vector::Int64Vector((Int64Vector *)this_00);
    (this->Map_).int64toindex_ = (Int64Vector *)this_00;
  }
  return (Int64Vector *)this_00;
}

Assistant:

inline ::CoreML::Specification::Int64Vector* DictVectorizer::mutable_int64toindex() {
  if (!has_int64toindex()) {
    clear_Map();
    set_has_int64toindex();
    Map_.int64toindex_ = new ::CoreML::Specification::Int64Vector;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.DictVectorizer.int64ToIndex)
  return Map_.int64toindex_;
}